

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putagreytile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                 int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  uint32_t uVar3;
  
  if (h != 0) {
    ppuVar2 = img->BWmap;
    uVar1 = img->samplesperpixel;
    do {
      uVar3 = w;
      if (w != 0) {
        do {
          *cp = ((uint)pp[1] << 0x18 | 0xffffff) & *ppuVar2[*pp];
          cp = cp + 1;
          pp = pp + uVar1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      pp = pp + fromskew;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putagreytile)
{
    int samplesperpixel = img->samplesperpixel;
    uint32_t **BWmap = img->BWmap;

    (void)y;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            *cp++ = BWmap[*pp][0] & ((uint32_t) * (pp + 1) << 24 | ~A1);
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}